

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

_Bool Curl_bufq_peek(bufq *q,uchar **pbuf,size_t *plen)

{
  buf_chunk *pbVar1;
  ulong uVar2;
  _Bool _Var3;
  size_t sVar4;
  
  pbVar1 = q->head;
  if ((pbVar1 != (buf_chunk *)0x0) && (pbVar1->w_offset <= pbVar1->r_offset)) {
    prune_head(q);
  }
  pbVar1 = q->head;
  if (pbVar1 != (buf_chunk *)0x0) {
    uVar2 = pbVar1->r_offset;
    sVar4 = pbVar1->w_offset - uVar2;
    if (uVar2 <= pbVar1->w_offset && sVar4 != 0) {
      *pbuf = (pbVar1->x).data + uVar2;
      _Var3 = true;
      goto LAB_00112add;
    }
  }
  *pbuf = (uchar *)0x0;
  sVar4 = 0;
  _Var3 = false;
LAB_00112add:
  *plen = sVar4;
  return _Var3;
}

Assistant:

bool Curl_bufq_peek(struct bufq *q,
                    const unsigned char **pbuf, size_t *plen)
{
  if(q->head && chunk_is_empty(q->head)) {
    prune_head(q);
  }
  if(q->head && !chunk_is_empty(q->head)) {
    chunk_peek(q->head, pbuf, plen);
    return TRUE;
  }
  *pbuf = NULL;
  *plen = 0;
  return FALSE;
}